

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O0

char * trim_string(char *str)

{
  byte *pbVar1;
  ushort **ppuVar2;
  size_t sVar3;
  bool bVar4;
  byte *local_20;
  char *end;
  char *str_local;
  
  end = str;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)*end] & 0x2000) != 0) {
    end = end + 1;
  }
  if (*end != '\0') {
    sVar3 = strlen(end);
    local_20 = (byte *)(end + sVar3);
    do {
      pbVar1 = local_20;
      local_20 = pbVar1 + -1;
      bVar4 = false;
      if (end < local_20) {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)(uint)*local_20] & 0x2000) != 0;
      }
    } while (bVar4);
    *pbVar1 = 0;
  }
  return end;
}

Assistant:

static char *trim_string(char *str)
{
	char *end;

	while (isspace((unsigned char)*str))
		str++;

	if (*str == '\0')
	{
		return str;
	}

	end = str + strlen(str) - 1;
	while (end > str && isspace((unsigned char)*end))
		end--;
	end[1] = '\0';

	return str;
}